

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O3

void ast::Sections::binary_raw
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  uint address;
  ofstream file;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,file_name,_S_out);
  for (address = lower_address + byte_order; address < higher_address; address = address + word_size
      ) {
    Memory_space::read8((Memory_space *)memory,address);
    std::ostream::put((char)&local_228);
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void Sections::binary_raw(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		for (auto address = lower_address + byte_order; address < higher_address; ) {
			uint8_t c = memory.read8(address);
			file.put(c);
			address += word_size;
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}